

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::Ensure(Parser *this,bool condition,string *message,TiXmlBase *base)

{
  int iVar1;
  ostream *poVar2;
  TiXmlBase *base_local;
  string *message_local;
  bool condition_local;
  Parser *this_local;
  
  if (!condition) {
    std::operator<<((ostream *)&std::cerr,"ERROR: ");
    if (base != (TiXmlBase *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)this);
      poVar2 = std::operator<<(poVar2,":");
      iVar1 = util::tinyxml::TiXmlBase::Row(base);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar2," ");
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)message);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  return;
}

Assistant:

void Parser::Ensure(bool condition, string message, TiXmlBase* base) const {
	if (!condition) {
		cerr << "ERROR: ";
		if (base != NULL)
			cerr << file_name_ << ":" << base->Row() << ":" << endl << " ";
		cerr << message << endl;
		exit(XML_INPUT_ERROR);
	}
}